

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O1

int output_existing_symbol
              (byte_t symbol,adh_node_t *node,byte_t *output_buffer,FILE *output_file_ptr)

{
  int iVar1;
  adh_node_t *paVar2;
  undefined7 in_register_00000039;
  
  paVar2 = adh_search_symbol_in_tree((adh_symbol_t)CONCAT71(in_register_00000039,symbol));
  iVar1 = output_bit_array(&paVar2->bit_array,output_buffer,output_file_ptr);
  if (iVar1 == 0) {
    adh_update_tree(node,false);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int output_existing_symbol(byte_t symbol, adh_node_t *node, byte_t *output_buffer, FILE* output_file_ptr) {
    // write symbol code
    adh_node_t* nodeSymbol = adh_search_symbol_in_tree(symbol);

#ifdef _DEBUG
    log_debug("  output_existing_symbol", "%s out_bit_idx=%-8d bin=%s\n",
             fmt_symbol(symbol),
             out_bit_idx,
             fmt_bit_array(&nodeSymbol->bit_array));
#endif

    int rc = output_bit_array(&(nodeSymbol->bit_array), output_buffer, output_file_ptr);
    if(rc != RC_OK)
        return rc;

    adh_update_tree(node, false);
    return RC_OK;
}